

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.c
# Opt level: O3

void uv__stream_close(uv_stream_t *handle)

{
  uint *puVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  ulong uVar6;
  void *ptr;
  
  uv__io_close(handle->loop,&handle->io_watcher);
  uv_read_stop(handle);
  uVar4 = handle->flags;
  if (((uVar4 & 4) != 0) &&
     (uVar3 = uVar4 & 0xfffffffb, uVar2 = uVar4 & 8, uVar4 = uVar3, uVar2 != 0)) {
    puVar1 = &handle->loop->active_handles;
    *puVar1 = *puVar1 - 1;
  }
  handle->flags = uVar4 & 0xffff3fff;
  iVar5 = (handle->io_watcher).fd;
  if (iVar5 != -1) {
    if (2 < iVar5) {
      uv__close(iVar5);
    }
    (handle->io_watcher).fd = -1;
  }
  if (handle->accepted_fd != -1) {
    uv__close(handle->accepted_fd);
    handle->accepted_fd = -1;
  }
  ptr = handle->queued_fds;
  if (ptr != (void *)0x0) {
    if (*(int *)((long)ptr + 4) != 0) {
      uVar6 = 0;
      do {
        uv__close(*(int *)((long)ptr + uVar6 * 4 + 8));
        uVar6 = uVar6 + 1;
      } while (uVar6 < *(uint *)((long)ptr + 4));
      ptr = handle->queued_fds;
    }
    uv__free(ptr);
    handle->queued_fds = (void *)0x0;
  }
  iVar5 = uv__io_active(&handle->io_watcher,5);
  if (iVar5 != 0) {
    __assert_fail("!uv__io_active(&handle->io_watcher, POLLIN | POLLOUT)",
                  "/workspace/llm4binary/github/license_c_cmakelists/xhawk18[P]s_task/libuv/src/unix/stream.c"
                  ,0x691,"void uv__stream_close(uv_stream_t *)");
  }
  return;
}

Assistant:

void uv__stream_close(uv_stream_t* handle) {
  unsigned int i;
  uv__stream_queued_fds_t* queued_fds;

#if defined(__APPLE__)
  /* Terminate select loop first */
  if (handle->select != NULL) {
    uv__stream_select_t* s;

    s = handle->select;

    uv_sem_post(&s->close_sem);
    uv_sem_post(&s->async_sem);
    uv__stream_osx_interrupt_select(handle);
    uv_thread_join(&s->thread);
    uv_sem_destroy(&s->close_sem);
    uv_sem_destroy(&s->async_sem);
    uv__close(s->fake_fd);
    uv__close(s->int_fd);
    uv_close((uv_handle_t*) &s->async, uv__stream_osx_cb_close, NULL);

    handle->select = NULL;
  }
#endif /* defined(__APPLE__) */

  uv__io_close(handle->loop, &handle->io_watcher);
  uv_read_stop(handle);
  uv__handle_stop(handle);
  handle->flags &= ~(UV_HANDLE_READABLE | UV_HANDLE_WRITABLE);

  if (handle->io_watcher.fd != -1) {
    /* Don't close stdio file descriptors.  Nothing good comes from it. */
    if (handle->io_watcher.fd > STDERR_FILENO)
      uv__close(handle->io_watcher.fd);
    handle->io_watcher.fd = -1;
  }

  if (handle->accepted_fd != -1) {
    uv__close(handle->accepted_fd);
    handle->accepted_fd = -1;
  }

  /* Close all queued fds */
  if (handle->queued_fds != NULL) {
    queued_fds = handle->queued_fds;
    for (i = 0; i < queued_fds->offset; i++)
      uv__close(queued_fds->fds[i]);
    uv__free(handle->queued_fds);
    handle->queued_fds = NULL;
  }

  assert(!uv__io_active(&handle->io_watcher, POLLIN | POLLOUT));
}